

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_sxx_syy.cpp
# Opt level: O2

AggregateFunction * duckdb::RegrSYYFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType LStack_58;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LogicalType(&LStack_58,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrSState,double,double,double,duckdb::RegrSYYOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,&LStack_58,in_R8);
  LogicalType::~LogicalType(&LStack_58);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction RegrSYYFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrSState, double, double, double, RegrSYYOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}